

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DExporter::Export_Material(X3DExporter *this,size_t pIdxMaterial,size_t pTabLevel)

{
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  aiScene *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  aiScene **ppaVar5;
  pointer pcVar6;
  aiMaterial *pMat;
  bool bVar7;
  char cVar8;
  aiReturn aVar9;
  mapped_type *pmVar10;
  _Node *p_Var11;
  undefined8 *puVar12;
  Logger *this_00;
  long *plVar13;
  _Base_ptr p_Var14;
  size_t sVar15;
  size_type *psVar16;
  _Base_ptr p_Var17;
  char cVar18;
  undefined8 uVar19;
  X3DExporter *pXVar20;
  aiVector2D aVar21;
  aiScene **ppaVar22;
  byte bVar23;
  float tvalf;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  anon_class_16_2_65aab299 Color4ToAttrList;
  aiColor4D color4;
  aiColor3D color3;
  anon_class_8_1_15d7a4cc RepeatToAttrList;
  string material_name;
  string __str;
  aiString ai_mat_name;
  ai_real local_934;
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  local_930;
  SAttribute local_918;
  undefined1 local_8d8 [8];
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  *plStack_8d0;
  undefined1 local_8c8 [16];
  aiColor3D local_8b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8a8;
  aiColor3D local_898;
  size_t local_888;
  aiScene **local_880;
  long local_878;
  aiScene *local_870;
  undefined8 uStack_868;
  size_t local_860;
  float local_854;
  float local_850;
  float local_84c;
  undefined1 local_848 [5];
  undefined1 auStack_843 [3];
  IOStream *pIStack_840;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_838;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_828;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_818 [62];
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  _Alloc_hider local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408 [61];
  
  local_930._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_930;
  local_930._M_impl._M_node._M_size = 0;
  p_Var1 = &(this->mDEF_Map_Material)._M_t._M_impl.super__Rb_tree_header;
  p_Var17 = (this->mDEF_Map_Material)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var14 = &p_Var1->_M_header;
  for (; p_Var17 != (_Base_ptr)0x0;
      p_Var17 = (&p_Var17->_M_left)[*(ulong *)(p_Var17 + 1) < pIdxMaterial]) {
    if (*(ulong *)(p_Var17 + 1) >= pIdxMaterial) {
      p_Var14 = p_Var17;
    }
  }
  p_Var17 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var14 != p_Var1) &&
     (p_Var17 = p_Var14, pIdxMaterial < *(ulong *)(p_Var14 + 1))) {
    p_Var17 = &p_Var1->_M_header;
  }
  ppaVar5 = (aiScene **)(local_438 + 0x10);
  local_930._M_impl._M_node.super__List_node_base._M_prev =
       local_930._M_impl._M_node.super__List_node_base._M_next;
  local_860 = pIdxMaterial;
  local_438._0_8_ = ppaVar5;
  if ((_Rb_tree_header *)p_Var17 == p_Var1) {
    pMat = this->mScene->mMaterials[pIdxMaterial];
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"_IDX_","");
    sVar2 = local_860;
    cVar18 = '\x01';
    if (9 < local_860) {
      sVar15 = local_860;
      cVar8 = '\x04';
      do {
        cVar18 = cVar8;
        if (sVar15 < 100) {
          cVar18 = cVar18 + -2;
          goto LAB_003684a2;
        }
        if (sVar15 < 1000) {
          cVar18 = cVar18 + -1;
          goto LAB_003684a2;
        }
        if (sVar15 < 10000) goto LAB_003684a2;
        bVar7 = 99999 < sVar15;
        sVar15 = sVar15 / 10000;
        cVar8 = cVar18 + '\x04';
      } while (bVar7);
      cVar18 = cVar18 + '\x01';
    }
LAB_003684a2:
    local_888 = pTabLevel;
    _local_848 = (aiVector2D)&local_838;
    std::__cxx11::string::_M_construct((ulong)local_848,cVar18);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)_local_848,(uint)pIStack_840._0_4_,sVar2);
    paVar3 = (aiScene *)((long)&pIStack_840->_vptr_IOStream + local_438._8_8_);
    uVar19 = (aiScene *)0xf;
    if ((aiScene **)local_438._0_8_ != ppaVar5) {
      uVar19 = local_428._M_allocated_capacity;
    }
    if ((ulong)uVar19 < paVar3) {
      uVar19 = (aiScene *)0xf;
      if (_local_848 != (aiVector2D)&local_838) {
        uVar19 = local_838._M_allocated_capacity;
      }
      if ((ulong)uVar19 < paVar3) goto LAB_0036852d;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_848,0,(char *)0x0,local_438._0_8_);
    }
    else {
LAB_0036852d:
      puVar12 = (undefined8 *)std::__cxx11::string::_M_append(local_438,(ulong)_local_848);
    }
    local_880 = &local_870;
    ppaVar22 = (aiScene **)(puVar12 + 2);
    if ((aiScene **)*puVar12 == ppaVar22) {
      local_870 = *ppaVar22;
      uStack_868 = puVar12[3];
    }
    else {
      local_870 = *ppaVar22;
      local_880 = (aiScene **)*puVar12;
    }
    local_878 = puVar12[1];
    *puVar12 = ppaVar22;
    puVar12[1] = 0;
    *(undefined1 *)ppaVar22 = 0;
    if (_local_848 != (aiVector2D)&local_838) {
      operator_delete((void *)_local_848,(ulong)(local_838._M_allocated_capacity + 1));
    }
    if ((aiScene **)local_438._0_8_ != ppaVar5) {
      operator_delete((void *)local_438._0_8_,(ulong)(local_428._M_allocated_capacity + 1));
    }
    local_438._0_8_ = local_438._0_8_ & 0xffffff0000000000;
    memset(local_438 + 5,0x1b,0x3ff);
    aVar9 = aiGetMaterialString(pMat,"?mat.name",0,0,(aiString *)local_438);
    if (aVar9 == aiReturn_SUCCESS) {
      strlen(local_438 + 4);
      std::__cxx11::string::replace((ulong)&local_880,0,(char *)0x0,(ulong)(local_438 + 4));
    }
    _local_848 = (aiVector2D)&local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"DEF","");
    local_828._M_allocated_capacity = (size_type)local_818;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_828,local_880,(undefined1 *)(local_878 + (long)local_880));
    p_Var11 = std::__cxx11::
              list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              ::_M_create_node<Assimp::X3DExporter::SAttribute>
                        ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_930,(SAttribute *)local_848);
    std::__detail::_List_node_base::_M_hook(&p_Var11->super__List_node_base);
    local_930._M_impl._M_node._M_size = local_930._M_impl._M_node._M_size + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_828._M_allocated_capacity != local_818) {
      operator_delete((void *)local_828._M_allocated_capacity,local_818[0]._M_allocated_capacity + 1
                     );
    }
    if (_local_848 != (aiVector2D)&local_838) {
      operator_delete((void *)_local_848,(ulong)(local_838._M_allocated_capacity + 1));
    }
    pmVar10 = std::
              map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->mDEF_Map_Material,&local_860);
    std::__cxx11::string::_M_assign((string *)pmVar10);
    _local_848 = (aiVector2D)&local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"Appearance","");
    NodeHelper_OpenNode(this,(string *)local_848,local_888,false,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_930);
    if (_local_848 != (aiVector2D)&local_838) {
      operator_delete((void *)_local_848,(ulong)(local_838._M_allocated_capacity + 1));
    }
    std::__cxx11::
    _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    _M_clear(&local_930);
    local_930._M_impl._M_node._M_size = 0;
    local_8b8.r = 0.0;
    local_8b8.g = 0.0;
    local_8b8.b = 0.0;
    local_8d8 = (undefined1  [8])0x0;
    plStack_8d0 = (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                   *)0x0;
    local_848._0_4_ = 0.0;
    stack0xfffffffffffff7bc = 0.0;
    pIStack_840 = (IOStream *)0x0;
    local_930._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_930;
    local_930._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_930;
    local_918.Name._M_dataplus._M_p = (pointer)this;
    local_918.Name._M_string_length = (size_type)&local_930;
    aVar9 = aiGetMaterialColor(pMat,"$clr.ambient",0,0,(aiColor4D *)local_848);
    local_8b8._0_8_ = _local_848;
    local_8b8.b = pIStack_840._0_4_;
    if (aVar9 == aiReturn_SUCCESS) {
      local_854 = stack0xfffffffffffff7bc;
      local_850 = pIStack_840._0_4_;
      local_84c = (float)local_848._0_4_;
      pXVar20 = (X3DExporter *)local_848;
      _local_848 = (aiVector2D)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"ambientIntensity","");
      AttrHelper_FloatToAttrList
                (pXVar20,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_930,(string *)local_848,(local_84c + local_854 + local_850) / 3.0
                 ,0.2);
LAB_003688f2:
      if (_local_848 != (aiVector2D)&local_838) {
        operator_delete((void *)_local_848,(ulong)(local_838._M_allocated_capacity + 1));
      }
    }
    else {
      aVar9 = aiGetMaterialColor(pMat,"$clr.ambient",0,0,(aiColor4D *)local_8d8);
      if (aVar9 == aiReturn_SUCCESS) {
        pXVar20 = (X3DExporter *)local_848;
        _local_848 = (aiVector2D)&local_838;
        std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"ambientIntensity","");
        AttrHelper_FloatToAttrList
                  (pXVar20,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                            *)&local_930,(string *)local_848,
                   ((float)local_8d8._0_4_ + (float)local_8d8._4_4_ + plStack_8d0._0_4_) / 3.0,0.2);
        goto LAB_003688f2;
      }
    }
    local_848._0_4_ = 0.0;
    stack0xfffffffffffff7bc = 0.0;
    pIStack_840 = (IOStream *)0x0;
    aVar9 = aiGetMaterialColor(pMat,"$clr.diffuse",0,0,(aiColor4D *)local_848);
    local_8b8.r = (ai_real)local_848._0_4_;
    local_8b8.g = stack0xfffffffffffff7bc;
    local_8b8.b = pIStack_840._0_4_;
    if (aVar9 == aiReturn_SUCCESS) {
      pXVar20 = (X3DExporter *)local_848;
      _local_848 = (aiVector2D)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"diffuseColor","");
      local_898._0_8_ = (_List_node_base *)0x3f4ccccd3f4ccccd;
      local_898.b = 0.8;
      AttrHelper_Color3ToAttrList
                (pXVar20,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_930,(string *)local_848,&local_8b8,&local_898);
LAB_00368a1f:
      if (_local_848 != (aiVector2D)&local_838) {
        operator_delete((void *)_local_848,(ulong)(local_838._M_allocated_capacity + 1));
      }
    }
    else {
      aVar9 = aiGetMaterialColor(pMat,"$clr.diffuse",0,0,(aiColor4D *)local_8d8);
      if (aVar9 == aiReturn_SUCCESS) {
        _local_848 = (aiVector2D)&local_838;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"diffuseColor","");
        local_898._0_8_ = (_List_node_base *)0x3f4ccccd3f4ccccd;
        local_898.b = 0.8;
        Export_Material::anon_class_16_2_65aab299::operator()
                  ((anon_class_16_2_65aab299 *)&local_918,(string *)local_848,(aiColor4D *)local_8d8
                   ,&local_898);
        goto LAB_00368a1f;
      }
    }
    local_848._0_4_ = 0.0;
    stack0xfffffffffffff7bc = 0.0;
    pIStack_840 = (IOStream *)0x0;
    aVar9 = aiGetMaterialColor(pMat,"$clr.emissive",0,0,(aiColor4D *)local_848);
    local_8b8.r = (ai_real)local_848._0_4_;
    local_8b8.g = stack0xfffffffffffff7bc;
    local_8b8.b = pIStack_840._0_4_;
    if (aVar9 == aiReturn_SUCCESS) {
      pXVar20 = (X3DExporter *)local_848;
      _local_848 = (aiVector2D)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"emissiveColor","");
      local_898._0_8_ = (_List_node_base *)0x0;
      local_898.b = 0.0;
      AttrHelper_Color3ToAttrList
                (pXVar20,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_930,(string *)local_848,&local_8b8,&local_898);
LAB_00368b40:
      if (_local_848 != (aiVector2D)&local_838) {
        operator_delete((void *)_local_848,(ulong)(local_838._M_allocated_capacity + 1));
      }
    }
    else {
      aVar9 = aiGetMaterialColor(pMat,"$clr.emissive",0,0,(aiColor4D *)local_8d8);
      if (aVar9 == aiReturn_SUCCESS) {
        _local_848 = (aiVector2D)&local_838;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"emissiveColor","");
        local_898._0_8_ = (_List_node_base *)0x0;
        local_898.b = 0.0;
        Export_Material::anon_class_16_2_65aab299::operator()
                  ((anon_class_16_2_65aab299 *)&local_918,(string *)local_848,(aiColor4D *)local_8d8
                   ,&local_898);
        goto LAB_00368b40;
      }
    }
    aVar9 = aiGetMaterialFloatArray(pMat,"$mat.shininess",0,0,&local_934,(uint *)0x0);
    if (aVar9 == aiReturn_SUCCESS) {
      pXVar20 = (X3DExporter *)local_848;
      _local_848 = (aiVector2D)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"shininess","");
      AttrHelper_FloatToAttrList
                (pXVar20,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_930,(string *)local_848,local_934,0.2);
      if (_local_848 != (aiVector2D)&local_838) {
        operator_delete((void *)_local_848,(ulong)(local_838._M_allocated_capacity + 1));
      }
    }
    local_848._0_4_ = 0.0;
    stack0xfffffffffffff7bc = 0.0;
    pIStack_840 = (IOStream *)0x0;
    aVar9 = aiGetMaterialColor(pMat,"$clr.specular",0,0,(aiColor4D *)local_848);
    local_8b8.r = (ai_real)local_848._0_4_;
    local_8b8.g = stack0xfffffffffffff7bc;
    local_8b8.b = pIStack_840._0_4_;
    if (aVar9 == aiReturn_SUCCESS) {
      pXVar20 = (X3DExporter *)local_848;
      _local_848 = (aiVector2D)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"specularColor","");
      local_898._0_8_ = (_List_node_base *)0x0;
      local_898.b = 0.0;
      AttrHelper_Color3ToAttrList
                (pXVar20,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_930,(string *)local_848,&local_8b8,&local_898);
LAB_00368cdb:
      if (_local_848 != (aiVector2D)&local_838) {
        operator_delete((void *)_local_848,(ulong)(local_838._M_allocated_capacity + 1));
      }
    }
    else {
      aVar9 = aiGetMaterialColor(pMat,"$clr.specular",0,0,(aiColor4D *)local_8d8);
      if (aVar9 == aiReturn_SUCCESS) {
        _local_848 = (aiVector2D)&local_838;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"specularColor","");
        local_898._0_8_ = (_List_node_base *)0x0;
        local_898.b = 0.0;
        Export_Material::anon_class_16_2_65aab299::operator()
                  ((anon_class_16_2_65aab299 *)&local_918,(string *)local_848,(aiColor4D *)local_8d8
                   ,&local_898);
        goto LAB_00368cdb;
      }
    }
    aVar9 = aiGetMaterialFloatArray(pMat,"$mat.opacity",0,0,&local_934,(uint *)0x0);
    if (aVar9 == aiReturn_SUCCESS) {
      if (1.0 < local_934) {
        local_934 = 1.0;
      }
      local_934 = 1.0 - local_934;
      pXVar20 = (X3DExporter *)local_848;
      _local_848 = (aiVector2D)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"transparency","");
      AttrHelper_FloatToAttrList
                (pXVar20,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_930,(string *)local_848,local_934,0.0);
      if (_local_848 != (aiVector2D)&local_838) {
        operator_delete((void *)_local_848,(ulong)(local_838._M_allocated_capacity + 1));
      }
    }
    _local_848 = (aiVector2D)&local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"Material","");
    sVar2 = local_888 + 1;
    NodeHelper_OpenNode(this,(string *)local_848,sVar2,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_930);
    if (_local_848 != (aiVector2D)&local_838) {
      operator_delete((void *)_local_848,(ulong)(local_838._M_allocated_capacity + 1));
    }
    std::__cxx11::
    _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    _M_clear(&local_930);
    local_930._M_impl._M_node._M_size = 0;
    _local_848 = (aiVector2D)((ulong)_local_848 & 0xffffff0000000000);
    local_930._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_930;
    local_930._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_930;
    local_898._0_8_ = (_List_node_base *)&local_930;
    memset(local_848 + 5,0x1b,0x3ff);
    aVar9 = aiGetMaterialString(pMat,"$tex.file",1,0,(aiString *)local_848);
    if (aVar9 == aiReturn_SUCCESS) {
      if (local_848[4] == '*') {
        paVar4 = &local_918.Name.field_2;
        local_918.Name._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_918,"Embedded texture is not supported","");
        this_00 = DefaultLogger::get();
        Logger::error(this_00,local_918.Name._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_918.Name._M_dataplus._M_p != paVar4) {
          local_8a8._M_allocated_capacity =
               CONCAT44(local_918.Name.field_2._M_allocated_capacity._4_4_,
                        local_918.Name.field_2._M_allocated_capacity._0_4_);
          aVar21 = (aiVector2D)local_918.Name._M_dataplus._M_p;
LAB_00369048:
          operator_delete((void *)aVar21,local_8a8._M_allocated_capacity + 1);
        }
      }
      else {
        local_918.Name._M_dataplus._M_p = (pointer)&local_918.Name.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"url","");
        local_8b8._0_8_ = &local_8a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b8,"\"","");
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_8b8);
        local_8d8 = (undefined1  [8])local_8c8;
        pXVar20 = (X3DExporter *)(plVar13 + 2);
        if ((X3DExporter *)*plVar13 == pXVar20) {
          local_8c8._0_8_ = pXVar20->mScene;
          local_8c8._8_8_ = plVar13[3];
        }
        else {
          local_8c8._0_8_ = pXVar20->mScene;
          local_8d8 = (undefined1  [8])*plVar13;
        }
        plStack_8d0 = (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)plVar13[1];
        *plVar13 = (long)pXVar20;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append(local_8d8);
        paVar4 = &local_918.Value.field_2;
        psVar16 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_918.Value.field_2._M_allocated_capacity = *psVar16;
          local_918.Value.field_2._8_8_ = plVar13[3];
          local_918.Value._M_dataplus._M_p = (pointer)paVar4;
        }
        else {
          local_918.Value.field_2._M_allocated_capacity = *psVar16;
          local_918.Value._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_918.Value._M_string_length = plVar13[1];
        *plVar13 = (long)psVar16;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        p_Var11 = std::__cxx11::
                  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                  ::_M_create_node<Assimp::X3DExporter::SAttribute>
                            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                              *)&local_930,&local_918);
        std::__detail::_List_node_base::_M_hook(&p_Var11->super__List_node_base);
        local_930._M_impl._M_node._M_size = local_930._M_impl._M_node._M_size + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_918.Value._M_dataplus._M_p != paVar4) {
          operator_delete(local_918.Value._M_dataplus._M_p,
                          local_918.Value.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_918.Name._M_dataplus._M_p != &local_918.Name.field_2) {
          operator_delete(local_918.Name._M_dataplus._M_p,
                          CONCAT44(local_918.Name.field_2._M_allocated_capacity._4_4_,
                                   local_918.Name.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if (local_8d8 != (undefined1  [8])local_8c8) {
          operator_delete((void *)local_8d8,(ulong)((long)(uint *)local_8c8._0_8_ + 1));
        }
        aVar21 = (aiVector2D)local_8b8._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8b8._0_8_ != &local_8a8) goto LAB_00369048;
      }
    }
    bVar23 = 0;
    aVar9 = aiGetMaterialProperty(pMat,"$tex.mapmodeu",1,0,(aiMaterialProperty **)&local_918);
    if (((aVar9 == aiReturn_SUCCESS) &&
        (*(int *)((long)local_918.Name._M_dataplus._M_p + 0x40c) != 0)) &&
       (*(int *)((long)local_918.Name._M_dataplus._M_p + 0x410) == 5)) {
      bVar23 = **(byte **)(local_918.Name._M_dataplus._M_p + 0x418);
      bVar7 = true;
    }
    else {
      bVar7 = false;
    }
    paVar4 = &local_918.Name.field_2;
    if (bVar7) {
      local_918.Name._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"repeatS","");
      Export_Material::anon_class_8_1_15d7a4cc::operator()
                ((anon_class_8_1_15d7a4cc *)&local_898,&local_918.Name,(bool)(bVar23 & 1));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_918.Name._M_dataplus._M_p != paVar4) {
        operator_delete(local_918.Name._M_dataplus._M_p,
                        CONCAT44(local_918.Name.field_2._M_allocated_capacity._4_4_,
                                 local_918.Name.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    aVar9 = aiGetMaterialProperty(pMat,"$tex.mapmodev",1,0,(aiMaterialProperty **)&local_918);
    if (((aVar9 == aiReturn_SUCCESS) &&
        (*(int *)((long)local_918.Name._M_dataplus._M_p + 0x40c) != 0)) &&
       (*(int *)((long)local_918.Name._M_dataplus._M_p + 0x410) == 5)) {
      bVar23 = **(byte **)(local_918.Name._M_dataplus._M_p + 0x418);
      bVar7 = true;
    }
    else {
      bVar7 = false;
    }
    if (bVar7) {
      local_918.Name._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"repeatT","");
      Export_Material::anon_class_8_1_15d7a4cc::operator()
                ((anon_class_8_1_15d7a4cc *)&local_898,&local_918.Name,(bool)(bVar23 & 1));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_918.Name._M_dataplus._M_p != paVar4) {
        operator_delete(local_918.Name._M_dataplus._M_p,
                        CONCAT44(local_918.Name.field_2._M_allocated_capacity._4_4_,
                                 local_918.Name.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    local_918.Name._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"ImageTexture","");
    NodeHelper_OpenNode(this,&local_918.Name,sVar2,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_930);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_918.Name._M_dataplus._M_p != paVar4) {
      operator_delete(local_918.Name._M_dataplus._M_p,
                      CONCAT44(local_918.Name.field_2._M_allocated_capacity._4_4_,
                               local_918.Name.field_2._M_allocated_capacity._0_4_) + 1);
    }
    std::__cxx11::
    _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    _M_clear(&local_930);
    local_930._M_impl._M_node._M_size = 0;
    local_918.Name._M_dataplus._M_p = (pointer)0x0;
    local_918.Name._M_string_length = 0x3f8000003f800000;
    local_918.Name.field_2._M_allocated_capacity._0_4_ = 0.0;
    local_930._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_930;
    local_930._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_930;
    local_8d8 = (undefined1  [8])this;
    plStack_8d0 = (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                   *)&local_930;
    aVar9 = aiGetMaterialUVTransform(pMat,"$tex.uvtrafo",1,0,(aiUVTransform *)&local_918);
    if (aVar9 == aiReturn_SUCCESS) {
      _local_848 = (aiVector2D)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"translation","");
      local_8b8.r = 0.0;
      local_8b8.g = 0.0;
      Export_Material::anon_class_16_2_65aab299::operator()
                ((anon_class_16_2_65aab299 *)local_8d8,(string *)local_848,(aiVector2D *)&local_918,
                 (aiVector2D *)&local_8b8);
      if (_local_848 != (aiVector2D)&local_838) {
        operator_delete((void *)_local_848,(ulong)(local_838._M_allocated_capacity + 1));
      }
      pXVar20 = (X3DExporter *)local_848;
      _local_848 = (aiVector2D)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"rotation","");
      AttrHelper_FloatToAttrList
                (pXVar20,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_930,(string *)local_848,
                 (float)local_918.Name.field_2._M_allocated_capacity._0_4_,0.0);
      if (_local_848 != (aiVector2D)&local_838) {
        operator_delete((void *)_local_848,(ulong)(local_838._M_allocated_capacity + 1));
      }
      _local_848 = (aiVector2D)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"scale","");
      local_8b8.r = 1.0;
      local_8b8.g = 1.0;
      Export_Material::anon_class_16_2_65aab299::operator()
                ((anon_class_16_2_65aab299 *)local_8d8,(string *)local_848,
                 (aiVector2D *)&local_918.Name._M_string_length,(aiVector2D *)&local_8b8);
      if (_local_848 != (aiVector2D)&local_838) {
        operator_delete((void *)_local_848,(ulong)(local_838._M_allocated_capacity + 1));
      }
      _local_848 = (aiVector2D)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"TextureTransform","");
      NodeHelper_OpenNode(this,(string *)local_848,sVar2,true,
                          (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                           *)&local_930);
      if (_local_848 != (aiVector2D)&local_838) {
        operator_delete((void *)_local_848,(ulong)(local_838._M_allocated_capacity + 1));
      }
      std::__cxx11::
      _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
      ::_M_clear(&local_930);
      local_930._M_impl._M_node._M_size = 0;
      local_930._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_930;
      local_930._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_930;
    }
    _local_848 = (aiVector2D)&local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"Appearance","");
    NodeHelper_CloseNode(this,(string *)local_848,local_888);
    if (_local_848 != (aiVector2D)&local_838) {
      operator_delete((void *)_local_848,(ulong)(local_838._M_allocated_capacity + 1));
    }
    local_428._M_allocated_capacity = (size_type)local_870;
    ppaVar22 = local_880;
    if (local_880 == &local_870) goto LAB_003693ef;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"USE","");
    pmVar10 = std::
              map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at(&this->mDEF_Map_Material,&local_860);
    pcVar6 = (pmVar10->_M_dataplus)._M_p;
    local_418._M_p = (pointer)local_408;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_418,pcVar6,pcVar6 + pmVar10->_M_string_length);
    p_Var11 = std::__cxx11::
              list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              ::_M_create_node<Assimp::X3DExporter::SAttribute>
                        ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_930,(SAttribute *)local_438);
    std::__detail::_List_node_base::_M_hook(&p_Var11->super__List_node_base);
    local_930._M_impl._M_node._M_size = local_930._M_impl._M_node._M_size + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_p != local_408) {
      operator_delete(local_418._M_p,local_408[0]._M_allocated_capacity + 1);
    }
    if ((aiScene **)local_438._0_8_ != ppaVar5) {
      operator_delete((void *)local_438._0_8_,(ulong)(local_428._M_allocated_capacity + 1));
    }
    local_438._0_8_ = ppaVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Appearance","");
    NodeHelper_OpenNode(this,(string *)local_438,pTabLevel,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_930);
    ppaVar22 = (aiScene **)local_438._0_8_;
    if ((aiScene **)local_438._0_8_ == ppaVar5) goto LAB_003693ef;
  }
  operator_delete(ppaVar22,(ulong)((long)&((aiScene *)local_428._M_allocated_capacity)->mFlags + 1))
  ;
LAB_003693ef:
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear(&local_930);
  return;
}

Assistant:

void X3DExporter::Export_Material(const size_t pIdxMaterial, const size_t pTabLevel)
{
const char* NodeName_A = "Appearance";

list<SAttribute> attr_list;
aiMaterial& material = *mScene->mMaterials[pIdxMaterial];// create alias for conveniance.

	// Check if material already defined early.
	if(mDEF_Map_Material.find(pIdxMaterial) != mDEF_Map_Material.end())
	{
		// Material already defined, just refer to it
		attr_list.push_back({"USE", mDEF_Map_Material.at(pIdxMaterial)});
		NodeHelper_OpenNode(NodeName_A, pTabLevel, true, attr_list);

		return;
	}

	string material_name(string("_IDX_") + to_string(pIdxMaterial));// Create material name
	aiString ai_mat_name;

	if(material.Get(AI_MATKEY_NAME, ai_mat_name) == AI_SUCCESS) material_name.insert(0, ai_mat_name.C_Str());

	// Define material name.
	attr_list.push_back({"DEF", material_name});
	mDEF_Map_Material[pIdxMaterial] = material_name;

	//
	// "Appearance" node.
	//
	NodeHelper_OpenNode(NodeName_A, pTabLevel, false, attr_list);
	attr_list.clear();

	//
	// "Material" node.
	//
	{
		auto Color4ToAttrList = [&](const string& pAttrName, const aiColor4D& pAttrValue, const aiColor3D& pAttrDefaultValue)
		{
			string tstr;

			if(aiColor3D(pAttrValue.r, pAttrValue.g, pAttrValue.b) != pAttrDefaultValue)
			{
				AttrHelper_Col4DArrToString(&pAttrValue, 1, tstr);
				attr_list.push_back({pAttrName, tstr});
			}
		};

		float tvalf;
		aiColor3D color3;
		aiColor4D color4;

		// ambientIntensity="0.2"     SFFloat [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_AMBIENT, color3) == AI_SUCCESS)
			AttrHelper_FloatToAttrList(attr_list, "ambientIntensity", (color3.r + color3.g + color3.b) / 3.0f, 0.2f);
		else if(material.Get(AI_MATKEY_COLOR_AMBIENT, color4) == AI_SUCCESS)
			AttrHelper_FloatToAttrList(attr_list, "ambientIntensity", (color4.r + color4.g + color4.b) / 3.0f, 0.2f);

		// diffuseColor="0.8 0.8 0.8" SFColor [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_DIFFUSE, color3) == AI_SUCCESS)
			AttrHelper_Color3ToAttrList(attr_list, "diffuseColor", color3, aiColor3D(0.8f, 0.8f, 0.8f));
		else if(material.Get(AI_MATKEY_COLOR_DIFFUSE, color4) == AI_SUCCESS)
			Color4ToAttrList("diffuseColor", color4, aiColor3D(0.8f, 0.8f, 0.8f));

		// emissiveColor="0 0 0"      SFColor [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_EMISSIVE, color3) == AI_SUCCESS)
			AttrHelper_Color3ToAttrList(attr_list, "emissiveColor", color3, aiColor3D(0, 0, 0));
		else if(material.Get(AI_MATKEY_COLOR_EMISSIVE, color4) == AI_SUCCESS)
			Color4ToAttrList("emissiveColor", color4, aiColor3D(0, 0, 0));

		// shininess="0.2"            SFFloat [inputOutput]
		if(material.Get(AI_MATKEY_SHININESS, tvalf) == AI_SUCCESS) AttrHelper_FloatToAttrList(attr_list, "shininess", tvalf, 0.2f);

		// specularColor="0 0 0"      SFColor [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_SPECULAR, color3) == AI_SUCCESS)
			AttrHelper_Color3ToAttrList(attr_list, "specularColor", color3, aiColor3D(0, 0, 0));
		else if(material.Get(AI_MATKEY_COLOR_SPECULAR, color4) == AI_SUCCESS)
			Color4ToAttrList("specularColor", color4, aiColor3D(0, 0, 0));

		// transparency="0"           SFFloat [inputOutput]
		if(material.Get(AI_MATKEY_OPACITY, tvalf) == AI_SUCCESS)
		{
			if(tvalf > 1) tvalf = 1;

			tvalf = 1.0f - tvalf;
			AttrHelper_FloatToAttrList(attr_list, "transparency", tvalf, 0);
		}

		NodeHelper_OpenNode("Material", pTabLevel + 1, true, attr_list);
		attr_list.clear();
	}// "Material" node. END.

	//
	// "ImageTexture" node.
	//
	{
		auto RepeatToAttrList = [&](const string& pAttrName, const bool pAttrValue)
		{
			if(!pAttrValue) attr_list.push_back({pAttrName, "false"});
		};

		bool tvalb;
		aiString tstring;

		// url=""         MFString
		if(material.Get(AI_MATKEY_TEXTURE_DIFFUSE(0), tstring) == AI_SUCCESS)
		{
			if(strncmp(tstring.C_Str(), AI_EMBEDDED_TEXNAME_PREFIX, strlen(AI_EMBEDDED_TEXNAME_PREFIX)) == 0)
				LogError("Embedded texture is not supported");
			else
				attr_list.push_back({"url", string("\"") + tstring.C_Str() + "\""});
		}

		// repeatS="true" SFBool
		if(material.Get(AI_MATKEY_MAPPINGMODE_U_DIFFUSE(0), tvalb) == AI_SUCCESS) RepeatToAttrList("repeatS", tvalb);

		// repeatT="true" SFBool
		if(material.Get(AI_MATKEY_MAPPINGMODE_V_DIFFUSE(0), tvalb) == AI_SUCCESS) RepeatToAttrList("repeatT", tvalb);

		NodeHelper_OpenNode("ImageTexture", pTabLevel + 1, true, attr_list);
		attr_list.clear();
	}// "ImageTexture" node. END.

	//
	// "TextureTransform" node.
	//
	{
		auto Vec2ToAttrList = [&](const string& pAttrName, const aiVector2D& pAttrValue, const aiVector2D& pAttrDefaultValue)
		{
			string tstr;

			if(pAttrValue != pAttrDefaultValue)
			{
				AttrHelper_Vec2DArrToString(&pAttrValue, 1, tstr);
				attr_list.push_back({pAttrName, tstr});
			}
		};

		aiUVTransform transform;

		if(material.Get(AI_MATKEY_UVTRANSFORM_DIFFUSE(0), transform) == AI_SUCCESS)
		{
			Vec2ToAttrList("translation", transform.mTranslation, aiVector2D(0, 0));
			AttrHelper_FloatToAttrList(attr_list, "rotation", transform.mRotation, 0);
			Vec2ToAttrList("scale", transform.mScaling, aiVector2D(1, 1));

			NodeHelper_OpenNode("TextureTransform", pTabLevel + 1, true, attr_list);
			attr_list.clear();
		}
	}// "TextureTransform" node. END.

	//
	// Close opened nodes.
	//
	NodeHelper_CloseNode(NodeName_A, pTabLevel);

}